

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O1

int main(void)

{
  Am_Slot_Key AVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Am_Wrapper *pAVar7;
  char *pcVar8;
  Am_Object *pAVar9;
  ulong uVar10;
  Am_Object AVar11;
  Am_Object AVar12;
  Am_Constraint *pAVar13;
  Am_Value *pAVar14;
  ushort uVar15;
  Am_Image_Array alien_image;
  Am_Object Alien;
  Am_Object star_bitmap;
  Am_Image_Array bomb_image;
  Am_Image_Array ship_image;
  Am_Image_Array star_image;
  Am_Object AStack_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Image_Array local_40 [8];
  Am_Image_Array local_38 [8];
  Am_Image_Array local_30 [8];
  
  Am_Initialize();
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  Am_Object::Set(0x91c8,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  DESTROY = Am_Register_Slot_Name("Destroy something");
  NUM_ALIENS = Am_Register_Slot_Name("Number of aliens left on the screen");
  DIRECTION = Am_Register_Slot_Name("DIRECTION");
  pcVar8 = (char *)Am_Merge_Pathname("images/stars.gif");
  Am_Image_Array::Am_Image_Array(local_30,pcVar8);
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  Am_Object::Create((char *)&local_e8);
  pAVar7 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_30);
  pAVar9 = (Am_Object *)Am_Object::Set((ushort)&local_e8,(Am_Wrapper *)0xb0,(ulong)pAVar7);
  Am_Object::Am_Object(&local_d8,pAVar9);
  Am_Object::~Am_Object(&local_e8);
  pcVar8 = (char *)Am_Merge_Pathname("images/spaceship.gif");
  Am_Image_Array::Am_Image_Array((Am_Image_Array *)&local_e8,pcVar8);
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  pcVar8 = (char *)Am_Merge_Pathname("images/goodship.gif");
  Am_Image_Array::Am_Image_Array(local_38,pcVar8);
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  pcVar8 = (char *)Am_Merge_Pathname("images/bomb.gif");
  Am_Image_Array::Am_Image_Array(local_40,pcVar8);
  if (pcVar8 != (char *)0x0) {
    operator_delete__(pcVar8);
  }
  Am_Object::Create((char *)&AStack_f8);
  pAVar7 = Am_Image_Array::operator_cast_to_Am_Wrapper_((Am_Image_Array *)&local_e8);
  uVar15 = (ushort)&AStack_f8;
  uVar2 = Am_Object::Set(uVar15,(Am_Wrapper *)0xb0,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  Am_Object::Am_Object(&local_e0,pAVar9);
  Am_Object::~Am_Object(&AStack_f8);
  uVar10 = Am_Object::Get((ushort)&local_e0,0x66);
  uVar2 = Am_Object::Set((ushort)&local_e0,(Am_Value *)0x66,uVar10);
  uVar10 = Am_Object::Get((ushort)&local_e0,0x67);
  Am_Object::Set(uVar2,(Am_Value *)0x67,uVar10);
  Am_Object::Create((char *)&AStack_f8);
  Am_Object::operator=(&Aliens,&AStack_f8);
  Am_Object::~Am_Object(&AStack_f8);
  Am_Object::Create((char *)&AStack_f8);
  uVar2 = Am_Object::Set(uVar15,100,0x32);
  uVar2 = Am_Object::Set(uVar2,0x65,0x32);
  uVar2 = Am_Object::Set(uVar2,0x66,500);
  uVar2 = Am_Object::Set(uVar2,0x67,500);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Gray);
  AVar11.data = (Am_Object_Data *)Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  Am_Object::Create((char *)&local_f0);
  uVar2 = Am_Object::Set((ushort)&local_f0,100,0x1e);
  uVar2 = Am_Object::Set(uVar2,0x65,0x1e);
  uVar2 = Am_Object::Set(uVar2,0x66,0x1b8);
  AVar12.data = (Am_Object_Data *)Am_Object::Set(uVar2,0x67,0x1b8);
  Am_Object::Create((char *)&local_58);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_d8);
  uVar2 = Am_Object::Set((ushort)&local_58,(Am_Wrapper *)0xa5,(ulong)pAVar7);
  uVar2 = Am_Object::Set(uVar2,0xa2,5);
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar13);
  Am_Object::Create((char *)&local_60);
  pAVar14 = (Am_Value *)Am_Object::Get((ushort)&local_d8,0x67);
  uVar4 = Am_Value::operator_cast_to_int(pAVar14);
  uVar3 = Am_Object::Set((ushort)&local_60,0x181,(ulong)~uVar4);
  uVar3 = Am_Object::Set(uVar3,0x182,0);
  uVar3 = Am_Object::Set(uVar3,0xfc,0x1b);
  Am_Object::Create((char *)&local_68);
  pAVar9 = (Am_Object *)Am_Object::Set_Part(uVar3,(Am_Object)0xc5,(ulong)&local_68);
  pAVar9 = (Am_Object *)Am_Object::operator=(&star_animator,pAVar9);
  uVar10 = Am_Animate_With(pAVar9);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x65,uVar10);
  Am_Object::Am_Object(&local_50,pAVar9);
  AVar12.data = (Am_Object_Data *)Am_Object::Add_Part(AVar12,SUB81(&local_50,0),1);
  Am_Object::Create((char *)&local_78);
  pAVar7 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_38);
  uVar2 = Am_Object::Set((ushort)&local_78,(Am_Wrapper *)0xb0,(ulong)pAVar7);
  uVar2 = Am_Object::Set(uVar2,100,0xfa);
  Am_Object::Create((char *)&local_80);
  pAVar9 = (Am_Object *)Am_Object::Set((ushort)&local_80,0xfc,100);
  uVar10 = Am_Animate_With(pAVar9);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,uVar10);
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)top_of_ship);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x65,(ulong)pAVar13);
  pAVar9 = (Am_Object *)Am_Object::operator=(&Ship,pAVar9);
  Am_Object::Am_Object(&local_70,pAVar9);
  AVar12.data = (Am_Object_Data *)Am_Object::Add_Part(AVar12,SUB81(&local_70,0),1);
  uVar2 = Am_Object::Add(0x82f8,(uint)NUM_ALIENS,0x24);
  uVar2 = Am_Object::Set(uVar2,0x65,0x1e);
  uVar2 = Am_Object::Add(uVar2,(uint)DIRECTION,1);
  uVar2 = Am_Object::Set(uVar2,100,0);
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)alien_position);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,(ulong)pAVar13);
  Am_Object::Create((char *)&local_90);
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)alien_velocity);
  uVar3 = Am_Object::Set((ushort)&local_90,(Am_Constraint *)0xfc,(ulong)pAVar13);
  Am_Object::Create((char *)&local_a0);
  pAVar9 = (Am_Object *)
           Am_Object::Set((ushort)&local_a0,(Am_Method_Wrapper *)0xca,
                          (ulong)move_aliens_down.from_wrapper);
  Am_Object::Am_Object(&local_98,pAVar9);
  pAVar9 = (Am_Object *)Am_Object::Set_Part(uVar3,(Am_Object)0xc5,(ulong)&local_98);
  pAVar9 = (Am_Object *)Am_Object::operator=(&alien_animator,pAVar9);
  uVar10 = Am_Animate_With(pAVar9);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x64,uVar10);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_e0);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xa5,(ulong)pAVar7);
  uVar2 = Am_Object::Set(uVar2,0xa2,0x24);
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
  uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar13);
  uVar2 = Am_Object::Set(uVar2,0x9c,6);
  uVar2 = Am_Object::Set(uVar2,0x95,0xf);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar2,0x96,0xf);
  Am_Object::Am_Object(&local_88,pAVar9);
  pAVar9 = (Am_Object *)Am_Object::Add_Part(AVar12,SUB81(&local_88,0),1);
  Am_Object::Am_Object(&local_48,pAVar9);
  AVar11.data = (Am_Object_Data *)Am_Object::Add_Part(AVar11,SUB81(&local_48,0),1);
  Am_Object::Create((char *)&local_c0);
  uVar2 = Am_Object::Set((ushort)&local_c0,(char *)0xb9,0x106130);
  uVar10 = Am_Object::Set(uVar2,true,1);
  Am_Object::Get_Object((ushort)&local_b8,uVar10);
  uVar10 = Am_Object::Set((ushort)&local_b8,(Am_Method_Wrapper *)0xca,
                          (ulong)keyboard_controls.from_wrapper);
  Am_Object::Get_Object((ushort)&local_b0,uVar10);
  pAVar9 = (Am_Object *)Am_Object::Set((ushort)&local_b0,0xcd,200);
  Am_Object::Am_Object(&local_a8,pAVar9);
  pAVar9 = (Am_Object *)Am_Object::Add_Part(AVar11,SUB81(&local_a8,0),1);
  Am_Object::operator=(&my_window,pAVar9);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_98);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&AStack_f8);
  Am_Object::Create((char *)&AStack_f8);
  uVar2 = Am_Object::Set(uVar15,0x66,4);
  uVar2 = Am_Object::Set(uVar2,0x67,0x10);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_No_Style);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  AVar1 = DESTROY;
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)destroy_alien);
  pAVar9 = (Am_Object *)Am_Object::Add(uVar2,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar13);
  Am_Object::operator=(&Bullet,pAVar9);
  Am_Object::~Am_Object(&AStack_f8);
  pAVar14 = (Am_Value *)Am_Object::Get(0x82d8,0x65);
  iVar5 = Am_Value::operator_cast_to_int(pAVar14);
  pAVar14 = (Am_Value *)Am_Object::Get(0x82e0,0x67);
  iVar6 = Am_Value::operator_cast_to_int(pAVar14);
  uVar2 = Am_Object::Set(0x82e0,0x65,(ulong)(uint)(iVar5 - iVar6));
  Am_Object::Create((char *)&AStack_f8);
  uVar3 = Am_Object::Set(uVar15,0xfc,300);
  pAVar9 = (Am_Object *)
           Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)bullet_done.from_wrapper);
  uVar10 = Am_Animate_With(pAVar9);
  Am_Object::Set(uVar2,(Am_Constraint *)0x65,uVar10);
  Am_Object::~Am_Object(&AStack_f8);
  Am_Object::Create((char *)&AStack_f8);
  AVar1 = DESTROY;
  pAVar13 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)bomb_destroy_ship);
  uVar2 = Am_Object::Add(uVar15,(Am_Constraint *)(ulong)AVar1,(ulong)pAVar13);
  pAVar7 = Am_Image_Array::operator_cast_to_Am_Wrapper_(local_40);
  uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0xb0,(ulong)pAVar7);
  uVar2 = Am_Object::Set(uVar2,0x65,0);
  Am_Object::Create((char *)&local_f0);
  uVar3 = Am_Object::Set((ushort)&local_f0,0xfc,200);
  pAVar9 = (Am_Object *)
           Am_Object::Set(uVar3,(Am_Method_Wrapper *)0xca,(ulong)bomb_done.from_wrapper);
  uVar10 = Am_Animate_With(pAVar9);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar2,(Am_Constraint *)0x65,uVar10);
  Am_Object::operator=(&Bomb,pAVar9);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&AStack_f8);
  Am_Object::Am_Object(&local_c8,&my_window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_c8,0),1);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::Am_Object(&local_d0,&star_animator);
  Am_Start_Animator((Am_Object_Data *)&local_d0,(Am_Value *)&Am_No_Value,(Am_Value *)&Am_No_Value);
  Am_Object::~Am_Object(&local_d0);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&local_e0);
  Am_Image_Array::~Am_Image_Array(local_40);
  Am_Image_Array::~Am_Image_Array(local_38);
  Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_e8);
  Am_Object::~Am_Object(&local_d8);
  Am_Image_Array::~Am_Image_Array(local_30);
  return 0;
}

Assistant:

int
main(void)
{
  Am_Initialize();
  Am_Bitmap.Set(Am_FILL_STYLE, Am_Black);
  DESTROY = Am_Register_Slot_Name("Destroy something");
  NUM_ALIENS = Am_Register_Slot_Name("Number of aliens left on the screen");
  DIRECTION = Am_Register_Slot_Name("DIRECTION");

  const char *fn = Am_Merge_Pathname("images/stars.gif");
  Am_Image_Array star_image(fn);
  delete[] fn;
  Am_Object star_bitmap = Am_Bitmap.Create().Set(Am_IMAGE, star_image);
  fn = Am_Merge_Pathname("images/spaceship.gif");
  Am_Image_Array alien_image(fn);
  delete[] fn;
  fn = Am_Merge_Pathname("images/goodship.gif");
  Am_Image_Array ship_image(fn);
  delete[] fn;
  fn = Am_Merge_Pathname("images/bomb.gif");
  Am_Image_Array bomb_image(fn);
  delete[] fn;

  Am_Object Alien = Am_Bitmap.Create()
                        .Set(Am_IMAGE, alien_image)
                        .Set(Am_LINE_STYLE, Am_Green);
  Alien.Set(Am_WIDTH, Alien.Get(Am_WIDTH)).Set(Am_HEIGHT, Alien.Get(Am_HEIGHT));

  Aliens = Am_Map.Create("Aliens");

  my_window =
      Am_Window.Create("My Window")
          .Set(Am_LEFT, 50)
          .Set(Am_TOP, 50)
          .Set(Am_WIDTH, 500)
          .Set(Am_HEIGHT, 500)
          .Set(Am_FILL_STYLE, Am_Motif_Gray)
          .Add_Part(
              Am_Group.Create()
                  .Set(Am_LEFT, 30)
                  .Set(Am_TOP, 30)
                  .Set(Am_WIDTH, 440)
                  .Set(Am_HEIGHT, 440)
                  .Add_Part(
                      Am_Map.Create()
                          .Set(Am_ITEM_PROTOTYPE, star_bitmap)
                          .Set(Am_ITEMS, 5)
                          .Set(Am_LAYOUT, Am_Vertical_Layout)
                          .Set(Am_TOP,
                               Am_Animate_With(
                                   star_animator =
                                       Am_Animator.Create()
                                           .Set(Am_VALUE_1,
                                                -(int)star_bitmap.Get(
                                                    Am_HEIGHT) -
                                                    1)
                                           .Set(Am_VALUE_2, 0)
                                           .Set(Am_VELOCITY, 27)
                                           .Set_Part(Am_COMMAND,
                                                     Am_Animation_Wrap_Command
                                                         .Create())))

#if 0
			.Add_Part(star_animator = Am_Animation_Interactor.Create()
				  .Set(Am_REPEAT_DELAY, Am_Time(20))
				  .Add_Part(Am_COMMAND, Am_Animator_Animation_Command.Create()
					    .Set(Am_SLOT_TO_ANIMATE, Am_TOP)
					    .Set(Am_TIME_FOR_ANIMATION, Am_Time(10000))
					    .Set(Am_VALUE_1, -(int)star_bitmap.Get(Am_HEIGHT)-1)
					    .Set(Am_VALUE_2, 0)
					    .Set(Am_ANIMATE_END_ACTION, Am_ANIMATION_WRAP)
					    )
				  )
#endif
                          )
                  .Add_Part(
                      Ship = Am_Bitmap.Create()
                                 .Set(Am_IMAGE, ship_image)
                                 .Set(Am_LEFT, 250)
                                 .Set(Am_LEFT,
                                      Am_Animate_With(Am_Animator.Create().Set(
                                          Am_VELOCITY, 100) // pixels per sec
                                                      ))
                                 .Set(Am_TOP, top_of_ship))
                  .Add_Part(
                      Aliens.Add(NUM_ALIENS, START_NUM_ALIENS)
                          .Set(Am_TOP, 30)
                          .Add(DIRECTION, 1)
                          .Set(Am_LEFT, 0)
                          .Set(Am_LEFT, alien_position)
                          .Set(Am_LEFT,
                               Am_Animate_With(
                                   alien_animator =
                                       Am_Animator.Create()
                                           .Set(Am_VELOCITY, alien_velocity)
                                           .Set_Part(Am_COMMAND,
                                                     Am_Command.Create().Set(
                                                         Am_DO_METHOD,
                                                         move_aliens_down))))
                          .Set(Am_ITEM_PROTOTYPE, Alien)
                          .Set(Am_ITEMS, START_NUM_ALIENS)
                          .Set(Am_LAYOUT, Am_Vertical_Layout)
                          .Set(Am_MAX_RANK, 6)
                          .Set(Am_H_SPACING, 15)
                          .Set(Am_V_SPACING, 15)
#if 0
			.Add_Part(alien_animator = Am_Animation_Interactor.Create()
				  .Set(Am_REPEAT_DELAY, Am_Time(20))
				  .Add_Part(Am_COMMAND, Am_Constant_Velocity_Command.Create("foo24")
					    .Set (Am_SLOT_TO_ANIMATE, Am_LEFT)
					    .Set (Am_VALUE_1, left_of_aliens)
					    .Set (Am_VALUE_2, right_of_aliens)
					    .Set (Am_VELOCITY, alien_velocity)
					    .Set (Am_ANIMATE_END_METHOD, move_aliens_down)
					    .Set (Am_ANIMATE_END_ACTION, Am_ANIMATION_BOUNCE)
					    )
				  )
#endif
                          ))
          .Add_Part(Am_One_Shot_Interactor.Create()
                        .Set(Am_START_WHEN, "ANY_KEYBOARD")
                        .Set(Am_START_WHERE_TEST, true)
                        .Get_Object(Am_COMMAND)
                        .Set(Am_DO_METHOD, keyboard_controls)
                        .Get_Owner()
                        .Set(Am_PRIORITY, 200));

  Bullet = Am_Rectangle.Create("Bullet")
               .Set(Am_WIDTH, 4)
               .Set(Am_HEIGHT, 16)
               .Set(Am_FILL_STYLE, Am_Red)
               .Set(Am_LINE_STYLE, Am_No_Style)
               .Add(DESTROY, destroy_alien);
  Bullet.Set(Am_TOP, (int)Ship.Get(Am_TOP) - (int)Bullet.Get(Am_HEIGHT))
      .Set(Am_TOP, Am_Animate_With(Am_Animator.Create("Bullet Animator")
                                       .Set(Am_VELOCITY, 300)
                                       .Set(Am_DO_METHOD, bullet_done)));

  Bomb = Am_Bitmap.Create("Bomb")
             .Add(DESTROY, bomb_destroy_ship)
             .Set(Am_IMAGE, bomb_image)
             .Set(Am_TOP, 0)
             .Set(Am_TOP, Am_Animate_With(Am_Animator.Create("Bomb Animator")
                                              .Set(Am_VELOCITY, 200)
                                              .Set(Am_DO_METHOD, bomb_done)));

  // Problems with testing to see if the goodguy's ship is destroyed
  // or not: Where do I put the destructo test?  Best I can think of
  // is a method which is periodically run which tests whether
  // anything bad intersects with the ship.

  Am_Screen.Add_Part(my_window);

  Am_Start_Animator(star_animator);
  //Am_Start_Animator (alien_animator);
  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}